

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::GetDefinition(cmMakefile *this,string *name)

{
  Internals *this_00;
  cmState *this_01;
  cmVariableWatch *this_02;
  cmVariableWatch *vv;
  char *def;
  string *name_local;
  cmMakefile *this_local;
  
  this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  vv = (cmVariableWatch *)Internals::GetDefinition(this_00,name);
  if (vv == (cmVariableWatch *)0x0) {
    this_01 = GetState(this);
    vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(this_01,name);
  }
  this_02 = GetVariableWatch(this);
  if ((this_02 != (cmVariableWatch *)0x0) && ((this->SuppressWatches & 1U) == 0)) {
    if (vv == (cmVariableWatch *)0x0) {
      cmVariableWatch::VariableAccessed(this_02,name,1,(char *)0x0,this);
    }
    else {
      cmVariableWatch::VariableAccessed(this_02,name,0,(char *)vv,this);
    }
  }
  return (char *)vv;
}

Assistant:

const char* cmMakefile::GetDefinition(const std::string& name) const
{
  const char* def = this->Internal->GetDefinition(name);
  if(!def)
    {
    def = this->GetState()->GetInitializedCacheValue(name);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv && !this->SuppressWatches )
    {
    if ( def )
      {
      vv->VariableAccessed(name, cmVariableWatch::VARIABLE_READ_ACCESS,
        def, this);
      }
    else
      {
      vv->VariableAccessed(name,
          cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS, def, this);
      }
    }
#endif
  return def;
}